

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

int Gia_RsbRemovalCost(Gia_RsbMan_t *p,int Index)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  iVar1 = p->vObjs->nSize;
  uVar5 = 1 << ((byte)iVar1 & 0x1f);
  if (p->vSets[0]->nSize != uVar5) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == (1 << Vec_IntSize(p->vObjs))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x5a1,"int Gia_RsbRemovalCost(Gia_RsbMan_t *, int)");
  }
  if (p->vSets[1]->nSize == uVar5) {
    iVar4 = 0;
    if (iVar1 != 0x1f) {
      uVar9 = 1 << ((byte)Index & 0x1f);
      uVar8 = 1;
      if (1 < (int)uVar5) {
        uVar8 = (ulong)uVar5;
      }
      uVar10 = 0;
      lVar6 = 4;
      iVar4 = 0;
      do {
        if ((uVar9 & (uint)uVar10) == 0) {
          if ((((long)(int)uVar5 <= (long)uVar10) || (Index == 0x1f)) ||
             (uVar7 = uVar9 ^ (uint)uVar10, uVar5 <= uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          pVVar2 = p->vSets[0]->pArray;
          pVVar3 = p->vSets[1]->pArray;
          iVar4 = iVar4 + (pVVar3[uVar7].nSize + *(int *)((long)&pVVar3->nCap + lVar6)) *
                          (pVVar2[uVar7].nSize + *(int *)((long)&pVVar2->nCap + lVar6));
        }
        uVar10 = uVar10 + 1;
        lVar6 = lVar6 + 0x10;
      } while (uVar8 != uVar10);
    }
    return iVar4;
  }
  __assert_fail("Vec_WecSize(p->vSets[1]) == (1 << Vec_IntSize(p->vObjs))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x5a2,"int Gia_RsbRemovalCost(Gia_RsbMan_t *, int)");
}

Assistant:

int Gia_RsbRemovalCost( Gia_RsbMan_t * p, int Index )
{
    Vec_Int_t * vTemp[2][2];
    //unsigned Mask = Abc_InfoMask( Index );
    int m, m2, Cost = 0, nLeaves = 1 << Vec_IntSize(p->vObjs);
    assert( Vec_WecSize(p->vSets[0]) == (1 << Vec_IntSize(p->vObjs)) );
    assert( Vec_WecSize(p->vSets[1]) == (1 << Vec_IntSize(p->vObjs)) );
    for ( m = 0; m < nLeaves; m++ )
    {
        if ( m & (1 << Index) )
            continue;
        m2 = m ^ (1 << Index);
        vTemp[0][0] = Vec_WecEntry(p->vSets[0], m);
        vTemp[0][1] = Vec_WecEntry(p->vSets[1], m);
        vTemp[1][0] = Vec_WecEntry(p->vSets[0], m2);
        vTemp[1][1] = Vec_WecEntry(p->vSets[1], m2);
        Cost += (Vec_IntSize(vTemp[0][0]) + Vec_IntSize(vTemp[1][0])) * (Vec_IntSize(vTemp[0][1]) + Vec_IntSize(vTemp[1][1]));
    }
    return Cost;
}